

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O0

pair<bool,_TimeRepresentation<count_time<9,_long>_>_>
helics::checkForTriggered(TimeDependencies *deps,Time nextEvent)

{
  bool bVar1;
  undefined8 extraout_RAX;
  pair<bool,_TimeRepresentation<count_time<9,_long>_>_> pVar2;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  TimeDependencies *__range1;
  bool triggered;
  Time me;
  TimeDependencies *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_40 [2];
  bool local_29;
  TimeRepresentation<count_time<9,_long>_> local_28 [2];
  TimeRepresentation<count_time<9,_long>_> local_18;
  pair<bool,_TimeRepresentation<count_time<9,_long>_>_> local_10;
  
  local_28[0].internalTimeCode = 0x7fffffffffffffff;
  local_29 = false;
  local_40[0]._M_current = (DependencyInfo *)TimeDependencies::begin(in_stack_ffffffffffffffa8);
  TimeDependencies::end(in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                           ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)in_stack_ffffffffffffffb0,
                            (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)in_stack_ffffffffffffffa8), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffb0 =
         __gnu_cxx::
         __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
         ::operator*(local_40);
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                      ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffffb0,
                       &local_18);
    if (bVar1) {
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                        (&(in_stack_ffffffffffffffb0->super_TimeData).Te,local_28);
      if (bVar1) {
        local_28[0].internalTimeCode =
             (in_stack_ffffffffffffffb0->super_TimeData).Te.internalTimeCode;
      }
    }
    else if ((in_stack_ffffffffffffffb0->nonGranting & 1U) == 0) {
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                        (&(in_stack_ffffffffffffffb0->super_TimeData).Te,local_28);
      if (bVar1) {
        local_28[0].internalTimeCode =
             (in_stack_ffffffffffffffb0->super_TimeData).Te.internalTimeCode;
      }
    }
    else if ((in_stack_ffffffffffffffb0->triggered & 1U) != 0) {
      local_29 = true;
    }
    __gnu_cxx::
    __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(local_40);
  }
  std::pair<bool,_TimeRepresentation<count_time<9,_long>_>_>::
  pair<bool_&,_TimeRepresentation<count_time<9,_long>_>_&,_true>(&local_10,&local_29,local_28);
  pVar2._1_7_ = (undefined7)((ulong)extraout_RAX >> 8);
  pVar2.first = local_10.first;
  pVar2.second.internalTimeCode = local_10.second.internalTimeCode;
  return pVar2;
}

Assistant:

static std::pair<bool, Time> checkForTriggered(const TimeDependencies& deps, Time nextEvent)
{
    Time me{Time::maxVal()};
    bool triggered{false};
    for (const auto& dep : deps) {
        if (dep.next > nextEvent) {
            if (dep.Te < me) {
                me = dep.Te;
            }
            continue;
        }
        if (dep.nonGranting) {
            if (dep.triggered) {
                triggered = true;
            }
        } else {
            if (dep.Te < me) {
                me = dep.Te;
            }
        }
    }
    return {triggered, me};
}